

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatUtils.h
# Opt level: O1

void xSAT_UtilSort(void **pArray,int nSize,_func_int_void_ptr_void_ptr *CompFnct)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  void *pvVar5;
  int iVar6;
  xSAT_Clause_t *pC2;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  void **ppvVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  xSAT_Clause_t *pC1;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  void **CompFnct_00;
  
  uVar14 = (ulong)(uint)nSize;
LAB_008e7ed0:
  iVar11 = (int)uVar14;
  if (iVar11 < 0x10) {
    if (1 < iVar11) {
      uVar8 = 1;
      uVar12 = 0;
      do {
        uVar9 = uVar8;
        uVar15 = uVar12 & 0xffffffff;
        do {
          puVar2 = (uint *)pArray[uVar9];
          puVar3 = (uint *)pArray[(int)uVar15];
          uVar1 = puVar2[1];
          if (((long)(int)uVar1 < 3) || (puVar3[1] != 2)) {
            uVar16 = uVar15;
            if ((uVar1 != 2) || ((int)puVar3[1] < 2)) {
              if (*puVar3 >> 4 < *puVar2 >> 4) goto LAB_008e8059;
              if ((*puVar3 >> 4 <= *puVar2 >> 4) &&
                 (uVar16 = uVar9 & 0xffffffff,
                 puVar3[(long)(int)puVar3[1] + 2] <= puVar2[(long)(int)uVar1 + 2])) {
                uVar16 = uVar15;
              }
            }
          }
          else {
LAB_008e8059:
            uVar16 = uVar9 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
          uVar15 = uVar16;
        } while (uVar14 != uVar9);
        pvVar5 = pArray[uVar12];
        pArray[uVar12] = pArray[(int)uVar16];
        uVar12 = uVar12 + 1;
        pArray[(int)uVar16] = pvVar5;
        uVar8 = uVar8 + 1;
      } while (uVar12 != iVar11 - 1);
    }
    return;
  }
  puVar2 = (uint *)pArray[uVar14 >> 1];
  uVar1 = puVar2[1];
  lVar21 = -1;
LAB_008e7f07:
  uVar20 = (uint)lVar21;
  lVar17 = (long)(int)uVar20;
  lVar19 = 0;
  lVar18 = 0;
  while( true ) {
    puVar3 = (uint *)pArray[lVar17 + lVar18 + 1];
    uVar13 = puVar3[1];
    if ((((long)(int)uVar13 < 3) || (puVar2[1] != 2)) &&
       (((uVar13 == 2 && (1 < (int)puVar2[1])) ||
        ((*puVar3 >> 4 <= *puVar2 >> 4 &&
         ((*puVar3 >> 4 < *puVar2 >> 4 ||
          (puVar2[(long)(int)puVar2[1] + 2] <= puVar3[(long)(int)uVar13 + 2])))))))) break;
    lVar18 = lVar18 + 1;
    lVar19 = lVar19 + -8;
  }
  iVar6 = (int)lVar18;
  uVar14 = (ulong)(int)uVar14;
  lVar21 = lVar17 + lVar18 + 1;
  ppvVar10 = pArray + -1 + uVar14;
  CompFnct_00 = pArray + -1;
  do {
    uVar13 = (int)uVar14 - 1;
    uVar14 = (ulong)uVar13;
    puVar4 = (uint *)*ppvVar10;
    if (((int)uVar1 < 3) || (puVar4[1] != 2)) {
      if ((uVar1 == 2) && (1 < (int)puVar4[1])) break;
      uVar7 = *puVar4 >> 4;
      CompFnct_00 = (void **)(ulong)uVar7;
      if ((*puVar2 >> 4 <= uVar7) &&
         ((*puVar2 >> 4 < uVar7 ||
          (CompFnct_00 = (void **)(ulong)puVar2[(long)(int)uVar1 + 2],
          puVar4[(long)(int)puVar4[1] + 2] <= puVar2[(long)(int)uVar1 + 2])))) break;
    }
    ppvVar10 = ppvVar10 + -1;
  } while( true );
  if ((int)uVar13 <= (int)(uVar20 + 1 + iVar6)) goto LAB_008e7fd3;
  pArray[lVar17 + lVar18 + 1] = puVar4;
  *ppvVar10 = puVar3;
  goto LAB_008e7f07;
LAB_008e7fd3:
  xSAT_UtilSort(pArray,uVar20 + iVar6 + 1,(_func_int_void_ptr_void_ptr *)CompFnct_00);
  pArray = (void **)((long)pArray + ((long)(int)uVar20 * 8 - lVar19) + 8);
  uVar14 = (ulong)((~uVar20 + iVar11) - iVar6);
  goto LAB_008e7ed0;
}

Assistant:

static void xSAT_UtilSort( void** pArray, int nSize, int(* CompFnct )( const void *, const void *) )
{
    if ( nSize <= 15 )
        xSAT_UtilSelectSort( pArray, nSize, CompFnct );
    else
    {
        void* pPivot = pArray[nSize / 2];
        void* pTmp;
        int i = -1;
        int j = nSize;

        for(;;)
        {
            do i++; while( CompFnct( pArray[i], pPivot ) );
            do j--; while( CompFnct( pPivot, pArray[j] ) );

            if ( i >= j )
                break;

            pTmp = pArray[i];
            pArray[i] = pArray[j];
            pArray[j] = pTmp;
        }

        xSAT_UtilSort( pArray, i, CompFnct );
        xSAT_UtilSort( pArray + i, ( nSize - i ), CompFnct );
    }
}